

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O0

void __thiscall
amrex::FArrayBox::FArrayBox(FArrayBox *this,Box *b,int n,bool alloc,bool shared,Arena *ar)

{
  byte in_CL;
  byte bVar1;
  undefined4 in_EDX;
  BaseFab<double> *in_RSI;
  Arena *in_RDI;
  undefined1 in_R8B;
  undefined8 in_R9;
  undefined2 in_stack_ffffffffffffffe8;
  
  bVar1 = in_CL & 1;
  BaseFab<double>::BaseFab
            (in_RSI,(Box *)(CONCAT44(in_EDX,CONCAT13(in_CL,CONCAT12(in_R8B,in_stack_ffffffffffffffe8
                                                                   ))) & 0xffffffff0101ffff),
             (int)((ulong)in_R9 >> 0x20),SUB81((ulong)in_R9 >> 0x18,0),SUB81((ulong)in_R9 >> 0x10,0)
             ,in_RDI);
  in_RDI->_vptr_Arena = (_func_int **)&PTR__FArrayBox_01aa2a00;
  *(undefined4 *)&in_RDI[2].arena_info.device_use_hostalloc = 0;
  if ((bVar1 & 1) != 0) {
    initVal((FArrayBox *)ar);
  }
  return;
}

Assistant:

FArrayBox::FArrayBox (const Box& b, int n, bool alloc, bool shared, Arena* ar)
    : BaseFab<Real>(b,n,alloc,shared,ar)
{
    if (alloc) initVal();
}